

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMFInterpolater.cpp
# Opt level: O0

void __thiscall
amrex::EBMFCellConsLinInterp::interp
          (EBMFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  bool bVar1;
  FabType FVar2;
  FabFactory<amrex::FArrayBox> *pFVar3;
  Box *bx;
  long lVar4;
  FArrayBox *this_00;
  MFIter *in_stack_00000008;
  FabArray<amrex::EBCellFlagFab> *in_stack_00000010;
  FabArray<amrex::EBCellFlagFab> *in_stack_00000018;
  MFIter *in_stack_00000020;
  undefined8 in_stack_00000030;
  undefined4 in_stack_00000038;
  int in_stack_00000048;
  int in_stack_0000004c;
  MultiFab *in_stack_00000050;
  int in_stack_0000005c;
  MultiFab *in_stack_00000060;
  MFCellConsLinInterp *in_stack_00000068;
  Array4<const_double> *crse;
  Array4<double> *fine;
  Array4<const_amrex::EBCellFlag> *crse_flag;
  FabType ctype;
  FabType ftype;
  EBCellFlagFab *fine_flag_fab;
  EBCellFlagFab *crse_flag_fab;
  Box *crse_bx;
  Box result;
  Box target_fine_region;
  MFIter mfi;
  FabArray<amrex::EBCellFlagFab> *fflags;
  FabArray<amrex::EBCellFlagFab> *cflags;
  EBFArrayBoxFactory *cfact;
  EBFArrayBoxFactory *ffact;
  undefined4 in_stack_000002b8;
  MFIter *mfi_00;
  undefined4 in_stack_fffffffffffffd2c;
  MFIter *in_stack_fffffffffffffd30;
  int *piVar5;
  anon_class_48_6_1567b642 *f;
  long local_2a8;
  IntVect *in_stack_fffffffffffffdc8;
  Box *in_stack_fffffffffffffdd0;
  MFCellConsLinInterp *in_stack_fffffffffffffdd8;
  Box *in_stack_fffffffffffffe20;
  EBCellFlagFab *in_stack_fffffffffffffe28;
  undefined1 local_1d0 [64];
  undefined1 *local_190;
  FabType local_188;
  FabType local_184;
  EBCellFlagFab *local_180;
  EBCellFlagFab *local_178;
  undefined1 local_15c [28];
  undefined1 *local_140;
  int local_134 [7];
  Box local_118;
  undefined1 local_fc [124];
  FabArray<amrex::EBCellFlagFab> *local_80;
  FabArray<amrex::EBCellFlagFab> *local_78;
  long local_70;
  long local_68;
  int *local_30;
  char *local_28;
  
  mfi_00 = in_stack_00000008;
  amrex::MFCellConsLinInterp::interp
            (in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000050,
             in_stack_0000004c,in_stack_00000048,(IntVect *)cflags,(Geometry *)cfact,
             (Geometry *)ffact,(Box *)CONCAT44(fcomp,nc),(IntVect *)finemf,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
             CONCAT44(ccomp,in_stack_000002b8),(int)crsemf);
  pFVar3 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x1425622);
  if (pFVar3 == (FabFactory<amrex::FArrayBox> *)0x0) {
    local_2a8 = 0;
  }
  else {
    local_2a8 = __dynamic_cast(pFVar3,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
  }
  local_68 = local_2a8;
  bx = (Box *)FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x1425673);
  if (bx == (Box *)0x0) {
    lVar4 = 0;
  }
  else {
    lVar4 = __dynamic_cast(bx,&FabFactory<amrex::FArrayBox>::typeinfo,&EBFArrayBoxFactory::typeinfo,
                           0);
  }
  if (((local_68 != 0) && (lVar4 != 0)) &&
     (local_70 = lVar4, bVar1 = EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x14256da),
     !bVar1)) {
    local_78 = EBFArrayBoxFactory::getMultiEBCellFlagFab((EBFArrayBoxFactory *)in_stack_00000010);
    local_80 = EBFArrayBoxFactory::getMultiEBCellFlagFab((EBFArrayBoxFactory *)in_stack_00000010);
    MFIter::MFIter(in_stack_fffffffffffffd30,
                   (FabArrayBase *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_00000038),
                   in_stack_00000030._7_1_);
    while (bVar1 = MFIter::isValid((MFIter *)(local_fc + 0x1c)), bVar1) {
      piVar5 = local_134;
      MFIter::validbox(in_stack_00000020);
      local_118.smallend.vect._0_8_ = *(undefined8 *)piVar5;
      local_118.bigend.vect[2] = piVar5[5];
      local_118.btype.itype = piVar5[6];
      local_118.bigend.vect[1] = (int)((ulong)*(undefined8 *)(piVar5 + 3) >> 0x20);
      local_118.smallend.vect[2] = (int)*(undefined8 *)(piVar5 + 2);
      local_118.bigend.vect[0] = (int)((ulong)*(undefined8 *)(piVar5 + 2) >> 0x20);
      local_30 = piVar5;
      Box::grow(&local_118,(IntVect *)in_stack_00000008);
      f = (anon_class_48_6_1567b642 *)local_fc;
      Box::operator&((Box *)in_stack_00000010,(Box *)mfi_00);
      amrex::MFCellConsLinInterp::CoarseBox
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      local_140 = local_15c;
      local_178 = FabArray<amrex::EBCellFlagFab>::operator[](in_stack_00000010,mfi_00);
      this_00 = FabArray<amrex::FArrayBox>::operator[]
                          ((FabArray<amrex::FArrayBox> *)in_stack_00000010,mfi_00);
      FVar2 = FArrayBox::getType(this_00);
      if (FVar2 != regular) {
        local_180 = FabArray<amrex::EBCellFlagFab>::operator[](in_stack_00000010,mfi_00);
        local_184 = EBCellFlagFab::getType(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        local_188 = EBCellFlagFab::getType(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        if ((local_184 == multivalued) || (local_188 == multivalued)) {
          local_28 = "EBCellConservativeLinear::interp: multivalued not implemented";
          Abort_host((char *)in_stack_00000020);
        }
        else if (local_184 != covered) {
          FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                    (in_stack_00000018,(MFIter *)in_stack_00000010);
          local_190 = local_1d0;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_00000018,(MFIter *)in_stack_00000010);
          in_stack_fffffffffffffe28 = (EBCellFlagFab *)&stack0xfffffffffffffde8;
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_00000018,(MFIter *)in_stack_00000010);
          LoopConcurrentOnCpu<amrex::EBMFCellConsLinInterp::interp(amrex::MultiFab_const&,int,amrex::MultiFab&,int,int,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Box_const&,amrex::IntVect_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int)::__0>
                    (bx,(int)((ulong)lVar4 >> 0x20),f);
        }
      }
      MFIter::operator++((MFIter *)(local_fc + 0x1c));
    }
    MFIter::~MFIter((MFIter *)in_stack_00000010);
  }
  return;
}

Assistant:

void
EBMFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                               IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                               Box const& dest_domain, IntVect const& ratio,
                               Vector<BCRec> const& bcs, int bcomp)
{
    MFCellConsLinInterp::interp(crsemf, ccomp, finemf, fcomp, nc, ng, cgeom, fgeom, dest_domain,
                                ratio, bcs, bcomp);

    auto const ffact = dynamic_cast<EBFArrayBoxFactory const*>(&finemf.Factory());
    auto const cfact = dynamic_cast<EBFArrayBoxFactory const*>(&crsemf.Factory());
    if (!ffact || !cfact || ffact->isAllRegular()) {
        return;
    }

    auto const& cflags = cfact->getMultiEBCellFlagFab();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& crse = crsemf.const_arrays();
        auto const& fine = finemf.arrays();
        auto const& cflg = cflags.const_arrays();
        ParallelFor(finemf, ng, nc,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            if (dest_domain.contains(i,j,k)) {
                int ic = amrex::coarsen(i,ratio[0]);
                int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                int kc = k;
#else
                int kc = amrex::coarsen(k,ratio[2]);
#endif
                if (cflg[box_no](ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                    fine[box_no](i,j,k,n+fcomp) = crse[box_no](ic,jc,kc,n+ccomp);
                }
            }
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
        auto const& fflags = ffact->getMultiEBCellFlagFab();
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
            Box const target_fine_region = amrex::grow(mfi.validbox(),ng) & dest_domain;
            Box const& crse_bx = CoarseBox(target_fine_region, ratio);
            const EBCellFlagFab& crse_flag_fab = cflags[mfi];
            if (crsemf[mfi].getType() != FabType::regular) {
                const EBCellFlagFab& fine_flag_fab = fflags[mfi];
                const FabType ftype = fine_flag_fab.getType(target_fine_region);
                const FabType ctype = crse_flag_fab.getType(crse_bx);
                if (ftype == FabType::multivalued || ctype == FabType::multivalued)
                {
                    amrex::Abort("EBCellConservativeLinear::interp: multivalued not implemented");
                }
                else if (ftype == FabType::covered)
                {
                    ; // don't need to do anything special
                }
                else
                {
                    const auto& crse_flag = cflags.const_array(mfi);
                    const auto& fine = finemf.array(mfi);
                    const auto& crse = crsemf.const_array(mfi);
                    amrex::LoopConcurrentOnCpu(target_fine_region, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        int ic = amrex::coarsen(i,ratio[0]);
                        int jc = amrex::coarsen(j,ratio[1]);
#if (AMREX_SPACEDIM == 2)
                        int kc = k;
#else
                        int kc = amrex::coarsen(k,ratio[2]);
#endif
                        if (crse_flag(ic,jc,kc).numNeighbors() < AMREX_D_TERM(3,*3,*3)) {
                            fine(i,j,k,n+fcomp) = crse(ic,jc,kc,n+ccomp);
                        }
                    });
                }
            }
        }
    }
}